

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Map.cpp
# Opt level: O0

Country * __thiscall Map::addNode(Map *this,int id,string *name,int continent)

{
  int id_00;
  Country *this_00;
  reference ppCVar1;
  string local_50;
  Country *local_30;
  Country *thisCountry;
  string *psStack_20;
  int continent_local;
  string *name_local;
  Map *pMStack_10;
  int id_local;
  Map *this_local;
  
  thisCountry._4_4_ = continent;
  psStack_20 = name;
  name_local._4_4_ = id;
  pMStack_10 = this;
  this_00 = (Country *)operator_new(0x30);
  id_00 = name_local._4_4_;
  std::__cxx11::string::string((string *)&local_50,(string *)name);
  Country::Country(this_00,id_00,&local_50,thisCountry._4_4_);
  std::__cxx11::string::~string((string *)&local_50);
  local_30 = this_00;
  std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::push_back
            (this->pMapCountries,&local_30);
  ppCVar1 = std::vector<Map::Continent_*,_std::allocator<Map::Continent_*>_>::operator[]
                      (this->pMapContinents,(long)(thisCountry._4_4_ + -1));
  Continent::addCountry(*ppCVar1,local_30);
  return local_30;
}

Assistant:

Map::Country* Map::addNode(int id, std::string name, int continent) {
    //create graph node
    auto* thisCountry = new Country(id, std::move(name), continent);
    //add node to graph (overall graph)
    pMapCountries->push_back(thisCountry);
    //add node to relevant subgraph
    (*pMapContinents)[continent - 1]->addCountry(thisCountry);
    return thisCountry;
}